

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicFixedWingAircraft.h
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedFixedWingAircraft::GED_EnhancedFixedWingAircraft
          (GED_EnhancedFixedWingAircraft *this,GED_BasicFixedWingAircraft *BFWA,KUINT8 SupFuelStatus
          ,KUINT8 AirMaintenanceStatus,KUINT8 PrimaryAmmunition,KUINT8 SecondaryAmmunition)

{
  KINT16 KVar1;
  KINT16 KVar2;
  KINT16 KVar3;
  KINT8 KVar4;
  KINT8 KVar5;
  KUINT8 KVar6;
  KINT8 KVar7;
  KINT8 KVar8;
  
  (this->super_GED_BasicFixedWingAircraft).super_GED.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicFixedWingAircraft_00224340;
  KVar1 = BFWA->m_i16Offsets[0];
  KVar2 = BFWA->m_i16Offsets[1];
  KVar3 = BFWA->m_i16Offsets[2];
  (this->super_GED_BasicFixedWingAircraft).m_ui16EntityID = BFWA->m_ui16EntityID;
  (this->super_GED_BasicFixedWingAircraft).m_i16Offsets[0] = KVar1;
  (this->super_GED_BasicFixedWingAircraft).m_i16Offsets[1] = KVar2;
  (this->super_GED_BasicFixedWingAircraft).m_i16Offsets[2] = KVar3;
  (this->super_GED_BasicFixedWingAircraft).m_EA.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityAppearance_00223948;
  (this->super_GED_BasicFixedWingAircraft).m_EA.m_Appearance = (BFWA->m_EA).m_Appearance;
  KVar4 = BFWA->m_i8Ori[1];
  KVar5 = BFWA->m_i8Ori[2];
  KVar6 = BFWA->m_ui8FuelStatus;
  KVar7 = BFWA->m_i8HoriDevi;
  KVar8 = BFWA->m_i8VertDevi;
  KVar1 = BFWA->m_i16Spd;
  (this->super_GED_BasicFixedWingAircraft).m_i8Ori[0] = BFWA->m_i8Ori[0];
  (this->super_GED_BasicFixedWingAircraft).m_i8Ori[1] = KVar4;
  (this->super_GED_BasicFixedWingAircraft).m_i8Ori[2] = KVar5;
  (this->super_GED_BasicFixedWingAircraft).m_ui8FuelStatus = KVar6;
  (this->super_GED_BasicFixedWingAircraft).m_i8HoriDevi = KVar7;
  (this->super_GED_BasicFixedWingAircraft).m_i8VertDevi = KVar8;
  (this->super_GED_BasicFixedWingAircraft).m_i16Spd = KVar1;
  (this->super_GED_BasicFixedWingAircraft).super_GED.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_EnhancedFixedWingAircraft_002244f8;
  this->m_ui8SupFuelStatus = SupFuelStatus;
  this->m_ui8AirMaintStatus = AirMaintenanceStatus;
  this->m_ui8PriAmmun = PrimaryAmmunition;
  this->m_ui8SecAmmun = SecondaryAmmunition;
  return;
}

Assistant:

class KDIS_EXPORT GED_BasicFixedWingAircraft : public GED
{
protected:

    KUINT16 m_ui16EntityID;

    KINT16 m_i16Offsets[3];

    EntityAppearance m_EA;

    KINT8 m_i8Ori[3];

    KUINT8 m_ui8FuelStatus;

    KINT8 m_i8HoriDevi;

    KINT8 m_i8VertDevi;

    KINT16 m_i16Spd;

public:

    static const KUINT16 GED_BASIC_FIXED_WING_AIRCRAFT_SIZE = 20;

    GED_BasicFixedWingAircraft();

    GED_BasicFixedWingAircraft(KDataStream &stream) noexcept(false);

    GED_BasicFixedWingAircraft( KUINT16 ID, KINT16 XOffset, KINT16 YOffset, KINT16 ZOffset, const EntityAppearance & EA, KINT8 Psi, KINT8 Theta,
                                KINT8 Phi, KUINT8 FuelStatus, KINT8 HorizontalDeviation, KINT8 VerticalDeviation, KINT16 Speed );

    virtual ~GED_BasicFixedWingAircraft();

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetGroupedEntityCategory
    // Description: Identifies the derived GED class.
    //              Not part of the DIS PDU.
    //************************************
    virtual KDIS::DATA_TYPE::ENUMS::GroupedEntityCategory GetGroupedEntityCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetLength
    // Description: Returns size of the GED in octets.
    //              Not part of the DIS PDU.
    //************************************
    virtual KUINT8 GetLength() const;


    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetEntityID
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetEntityID
    // Description: Entity identifier unique within the group.
    //              The Site Identifier and Application Identifiers shall be the same as
    //              those designated in the Group Entity ID field.
    // Parameter:   KUINT16 ID
    //************************************
    void SetEntityID(KUINT16 ID);
    KUINT16 GetEntityID() const;

    //************************************
    //              GetEntityLocationZOffset
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetEntityLocation
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetEntityLocationXOffset
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetEntityLocationYOffset
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetEntityLocationZOffset
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetEntityLocationXOffset
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetEntityLocationYOffset
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetEntityLocationZOffset
    // Description: Location of the grouped entity specified by a set of three offsets.
    //              Determined by the difference, in meters, of the grouped entity from the Group Reference Point.
    // Parameter:   KINT16
    //************************************
    void SetEntityLocation(KINT16 XOffset, KINT16 YOffset, KINT16 ZOffset);
    void SetEntityLocation(KINT16 Offsets[3]);
    void SetEntityLocationXOffset(KINT16 X);
    void SetEntityLocationYOffset(KINT16 Y);
    void SetEntityLocationZOffset(KINT16 Z);
    KINT16 GetEntityLocationXOffset() const;
    KINT16 GetEntityLocationYOffset() const;
    KINT16 GetEntityLocationZOffset() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetEntityAppearance
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetEntityAppearance
    // Description: Entity appearance bit field accessors/mutator
    // Parameter:   const EntityAppearance & EA
    //************************************
    void SetEntityAppearance(const EntityAppearance & EA);
    const EntityAppearance & GetEntityAppearance() const;
    EntityAppearance & GetEntityAppearance();

    //************************************
    //              GetEntityOrientationPhi
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetEntityOrientation
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetEntityOrientationPsi
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetEntityOrientationTheta
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetEntityOrientationPhi
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetEntityOrientationPsi
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetEntityOrientationTheta
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetEntityOrientationPhi
    // Description: Entity orientation in Euler angles, psi, theta and phi, in 25 milli radian increments.
    // Parameter:   KINT8
    //************************************
    void SetEntityOrientation(KINT8 Psi, KINT8 Theta, KINT8 Phi);
    void SetEntityOrientation(KINT8 Ori[3]);
    void SetEntityOrientationPsi(KINT8 P);
    void SetEntityOrientationTheta(KINT8 T);
    void SetEntityOrientationPhi(KINT8 P);
    KINT8 GetEntityOrientationPsi() const;
    KINT8 GetEntityOrientationTheta() const;
    KINT8 GetEntityOrientationPhi() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetFuelStatus
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetFuelStatus
    // Description: Represents the amount of primary fuel remaining.
    //              Specified in natural units of the specified system.
    // Parameter:   KUINT8  F, void
    //************************************
    void SetFuelStatus( KUINT8 F );
    KUINT8 GetFuelStatus() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetMovementDirection
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetMovementDirectionHorizontal
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetMovementDirectionVertical
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetMovementDirectionHorizontal
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetMovementDirectionVertical
    // Description: Movement Direction is specified as a horizontal and a vertical deviation from
    //              the Entity Orientation.
    //              Each deviation is specified in 25 milliradian increments.
    // Parameter:   KINT8 Horizontal, KINT8 H, KINT8 V, void
    // Parameter:   KINT8 Vertical, void
    //************************************
    void SetMovementDirection( KINT8 Horizontal, KINT8 Vertical );
    void SetMovementDirectionHorizontal( KINT8 H );
    void SetMovementDirectionVertical( KINT8 V );
    KINT8 GetMovementDirectionHorizontal() const;
    KINT8 GetMovementDirectionVertical() const;
    
    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::SetSpeed
    //              KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetSpeed
    // Description: Signed magnitude value of the entity�s absolute velocity vector.
    //              A negative value shall indicate that the entity is moving backwards.
    //              Specified in 0.1 meter per second increments for aircraft and meters
    //              per second for ground vehicles.
    // Parameter:   KINT16 S
    //************************************
    void SetSpeed(KINT16 S);
    KINT16 GetSpeed() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const GED_BasicFixedWingAircraft & Value ) const;
    KBOOL operator != ( const GED_BasicFixedWingAircraft & Value ) const;
}